

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsWindowsPELinker.cxx
# Opt level: O3

bool __thiscall
cmBinUtilsWindowsPELinker::ResolveDependency
          (cmBinUtilsWindowsPELinker *this,string *name,string *origin,string *path,bool *resolved)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *searchPath;
  pointer pbVar2;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_d0;
  undefined8 local_b8;
  undefined1 *local_b0;
  undefined8 local_a8;
  size_type local_a0;
  pointer local_98;
  undefined8 local_90;
  string local_88;
  undefined8 local_68;
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  __x = cmRuntimeDependencyArchive::GetSearchDirectories_abi_cxx11_
                  ((this->super_cmBinUtilsLinker).Archive);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_e8,__x);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert(&local_e8,
           (const_iterator)
           local_e8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start,origin);
  if (local_e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar2 = local_e8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_d0.first._M_str = (pbVar2->_M_dataplus)._M_p;
      local_d0.first._M_len = pbVar2->_M_string_length;
      local_d0.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_68 = 0;
      local_60 = 1;
      local_b0 = local_50;
      local_50[0] = 0x2f;
      local_b8 = 1;
      local_a8 = 0;
      local_98 = (name->_M_dataplus)._M_p;
      local_a0 = name->_M_string_length;
      local_90 = 0;
      views._M_len = 3;
      views._M_array = &local_d0;
      local_58 = local_b0;
      cmCatViews(&local_88,views);
      std::__cxx11::string::operator=((string *)path,(string *)&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      bVar1 = cmsys::SystemTools::PathExists(path);
      if (bVar1) {
        bVar1 = true;
        goto LAB_0055b6ed;
      }
      pbVar2 = pbVar2 + 1;
    } while (pbVar2 != local_e8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  bVar1 = false;
LAB_0055b6ed:
  *resolved = bVar1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e8);
  return true;
}

Assistant:

bool cmBinUtilsWindowsPELinker::ResolveDependency(std::string const& name,
                                                  std::string const& origin,
                                                  std::string& path,
                                                  bool& resolved)
{
  auto dirs = this->Archive->GetSearchDirectories();

#ifdef _WIN32
  char buf[MAX_PATH];
  unsigned int len;
  if ((len = GetWindowsDirectoryA(buf, MAX_PATH)) > 0) {
    dirs.insert(dirs.begin(), std::string(buf, len));
  }
  if ((len = GetSystemDirectoryA(buf, MAX_PATH)) > 0) {
    dirs.insert(dirs.begin(), std::string(buf, len));
  }
#endif

  dirs.insert(dirs.begin(), origin);

  for (auto const& searchPath : dirs) {
    path = cmStrCat(searchPath, '/', name);
    if (cmSystemTools::PathExists(path)) {
      resolved = true;
      return true;
    }
  }

  resolved = false;
  return true;
}